

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerLdFld(Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,
                   JnHelperMethod polymorphicHelperMethod,bool useInlineCache,
                   LabelInstr *labelBailOut,bool isHelper)

{
  LowererMD *this_00;
  JITTimePolymorphicInlineCache *pJVar1;
  code *pcVar2;
  bool bVar3;
  JitProfilingInstr *ldFldInstr_00;
  Instr *pIVar4;
  Opnd *this_01;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  undefined4 *puVar7;
  PropertySymOpnd *pPVar8;
  intptr_t address;
  AddrOpnd *opndArg;
  IntConstOpnd *opndArg_00;
  RegOpnd *opndBailOutArg;
  Lowerer *this_02;
  JnHelperMethod local_34;
  
  if (ldFldInstr->m_kind == InstrKindJitProfiling) {
    ldFldInstr_00 = IR::Instr::AsJitProfilingInstr(ldFldInstr);
    pIVar4 = LowerProfiledLdFld(this,ldFldInstr_00);
    return pIVar4;
  }
  pIVar4 = ldFldInstr->m_prev;
  this_01 = IR::Instr::UnlinkSrc1(ldFldInstr);
  if (ldFldInstr->m_opcode == LdSuperFld) {
    pOVar5 = IR::Instr::UnlinkSrc2(ldFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar5);
  }
  bVar3 = IR::Opnd::IsSymOpnd(this_01);
  if (bVar3) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_01);
    if (pSVar6->m_sym->m_kind != SymKindProperty) goto LAB_00545912;
  }
  else {
LAB_00545912:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x178b,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar3) goto LAB_00545b33;
    *puVar7 = 0;
  }
  local_34 = helperMethod;
  if (useInlineCache) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_01);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1790,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar3) {
LAB_00545b33:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd(this_01);
    pJVar1 = pPVar8->m_runtimePolymorphicInlineCache;
    pPVar8 = IR::Opnd::AsPropertySymOpnd(this_01);
    if ((polymorphicHelperMethod == helperMethod) ||
       (pJVar1 == (JITTimePolymorphicInlineCache *)0x0)) {
      opndArg = (AddrOpnd *)LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar8,isHelper);
    }
    else {
      address = JITTimePolymorphicInlineCache::GetAddr(pPVar8->m_runtimePolymorphicInlineCache);
      opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,false,(Var)0x0
                                 );
      local_34 = polymorphicHelperMethod;
    }
    LoadPropertySymAsArgument(this,ldFldInstr,this_01);
    this_00 = &this->m_lowererMD;
    pPVar8 = IR::Opnd::AsPropertySymOpnd(this_01);
    opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg_00->super_Opnd);
    this_02 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg->super_Opnd);
    pOVar5 = LoadFunctionBodyOpnd(this_02,ldFldInstr);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar5);
  }
  else {
    LoadScriptContext(this,ldFldInstr);
    LoadPropertySymAsArgument(this,ldFldInstr,this_01);
  }
  pSVar6 = IR::Opnd::AsSymOpnd(this_01);
  opndBailOutArg = IR::SymOpnd::CreatePropertyOwnerOpnd(pSVar6,this->m_func);
  pSVar6 = IR::Opnd::AsSymOpnd(this_01);
  bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
  if (bVar3) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_01);
    pPVar8 = IR::Opnd::AsPropertySymOpnd(&pSVar6->super_Opnd);
  }
  else {
    pPVar8 = (PropertySymOpnd *)0x0;
  }
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,ldFldInstr,local_34,labelBailOut,&opndBailOutArg->super_Opnd,pPVar8,
             isHelper);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerLdFld(
    IR::Instr * ldFldInstr,
    IR::JnHelperMethod helperMethod,
    IR::JnHelperMethod polymorphicHelperMethod,
    bool useInlineCache,
    IR::LabelInstr *labelBailOut,
    bool isHelper)
{
    if (ldFldInstr->IsJitProfilingInstr())
    {
        // If we want to profile then do something completely different
        return this->LowerProfiledLdFld(ldFldInstr->AsJitProfilingInstr());
    }

    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    src = ldFldInstr->UnlinkSrc1();
    if (ldFldInstr->m_opcode == Js::OpCode::LdSuperFld)
    {
        IR::Opnd * src2 = nullptr;
        src2 = ldFldInstr->UnlinkSrc2();
        m_lowererMD.LoadHelperArgument(ldFldInstr, src2);
    }

    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    if (useInlineCache)
    {
        IR::Opnd * inlineCacheOpnd;
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");
        if (src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache && polymorphicHelperMethod != helperMethod)
        {
            JITTimePolymorphicInlineCache * polymorphicInlineCache = src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache;
            helperMethod = polymorphicHelperMethod;
            inlineCacheOpnd = IR::AddrOpnd::New(polymorphicInlineCache->GetAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func);
        }
        else
        {
            // Need to load runtime inline cache opnd first before loading any helper argument
            // because LoadRuntimeInlineCacheOpnd may create labels marked as helper,
            // and cause op helper register push/pop save in x86, messing up with any helper arguments that is already pushed
            inlineCacheOpnd = this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd(), isHelper);
        }
        this->LoadPropertySymAsArgument(ldFldInstr, src);
        this-> m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        this->m_lowererMD.LoadHelperArgument(ldFldInstr, inlineCacheOpnd);
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    else
    {
        LoadScriptContext(ldFldInstr);
        this->LoadPropertySymAsArgument(ldFldInstr, src);
    }

    // Do we need to reload the type and slot array after the helper returns?
    // (We do if there's a propertySymOpnd downstream that needs it, i.e., the type is not dead.)
    IR::RegOpnd *opndBase = src->AsSymOpnd()->CreatePropertyOwnerOpnd(m_func);
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod, labelBailOut, opndBase, src->AsSymOpnd()->IsPropertySymOpnd() ? src->AsSymOpnd()->AsPropertySymOpnd() : nullptr, isHelper);

    return instrPrev;
}